

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  ZSTD_cwksp_alloc_phase_e ZVar1;
  ZSTD_strategy ZVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  uint *puVar10;
  ZSTD_match_t *pZVar11;
  ZSTD_optimal_t *pZVar12;
  byte bVar13;
  int iVar14;
  U32 UVar15;
  uint uVar16;
  U32 *pUVar17;
  ulong uVar18;
  long lVar19;
  U32 *pUVar20;
  int iVar21;
  U32 *pUVar22;
  U32 *pUVar23;
  size_t __n;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_ps_enable || 2 < cParams->strategy - ZSTD_greedy)))) {
    lVar19 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    lVar19 = 0;
  }
  bVar13 = (byte)cParams->hashLog;
  __n = 1L << (bVar13 & 0x3f);
  uVar7 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (uVar7 = 0, cParams->minMatch == 3)) {
    uVar7 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar7 = cParams->windowLog;
    }
  }
  pUVar23 = (U32 *)(4L << ((byte)uVar7 & 0x3f));
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    iVar21 = 0x42de2a;
    (ms->window).base = " ";
    (ms->window).dictBase = " ";
    iVar14 = 0x42de2c;
    (ms->window).nextSrc = (BYTE *)"id-ce-certificatePolicies";
    pUVar17 = (U32 *)ws->objectEnd;
    ws->tableValidEnd = pUVar17;
  }
  else {
    iVar14 = (int)(ms->window).nextSrc;
    iVar21 = (int)(ms->window).base;
    pUVar17 = (U32 *)ws->objectEnd;
  }
  ms->hashLog3 = uVar7;
  ms->lazySkipping = 0;
  UVar15 = iVar14 - iVar21;
  (ms->window).lowLimit = UVar15;
  (ms->window).dictLimit = UVar15;
  ms->nextToUpdate = UVar15;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  ws->tableEnd = pUVar17;
  if ((int)ws->phase < 1) {
    ws->tableValidEnd = pUVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pUVar17 & 0x3f);
    pUVar22 = (U32 *)((long)pUVar17 + uVar8);
    if (pUVar22 <= ws->workspaceEnd) {
      ws->objectEnd = pUVar22;
      ws->tableEnd = pUVar22;
      if (uVar8 != 0) {
        ws->tableValidEnd = pUVar22;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      pUVar17 = pUVar22;
      goto LAB_00355343;
    }
    ms->hashTable = (U32 *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pUVar22 = (U32 *)((long)pvVar9 + uVar8);
    if (pUVar22 <= ws->workspaceEnd) {
      ws->objectEnd = pUVar22;
      ws->tableEnd = pUVar22;
      if (uVar8 != 0) {
        ws->tableValidEnd = pUVar22;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      goto LAB_0035535f;
    }
    pUVar22 = (U32 *)0x0;
    if (uVar7 == 0) {
      pUVar23 = pUVar22;
    }
    ms->chainTable = (U32 *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pUVar20 = (U32 *)((long)pvVar9 + uVar8);
    if (pUVar20 <= ws->workspaceEnd) {
      ws->objectEnd = pUVar20;
      ws->tableEnd = pUVar20;
      if (uVar8 != 0) {
        ws->tableValidEnd = pUVar20;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      goto LAB_00355387;
    }
  }
  else {
LAB_00355343:
    pUVar22 = (U32 *)((4L << (bVar13 & 0x3f)) + (long)pUVar17);
    if (ws->allocStart < pUVar22) {
      ws->allocFailed = '\x01';
      pUVar20 = (U32 *)0x0;
      pUVar22 = pUVar17;
    }
    else {
      ws->tableEnd = pUVar22;
      pUVar20 = pUVar17;
    }
    ms->hashTable = pUVar20;
LAB_0035535f:
    pUVar20 = (U32 *)(lVar19 + (long)pUVar22);
    if (ws->allocStart < pUVar20) {
      ws->allocFailed = '\x01';
      pUVar20 = pUVar22;
      pUVar22 = (U32 *)0x0;
    }
    else {
      ws->tableEnd = pUVar20;
    }
    ms->chainTable = pUVar22;
    if (uVar7 == 0) {
      pUVar23 = (U32 *)0x0;
    }
LAB_00355387:
    pUVar17 = (U32 *)((long)pUVar23 + (long)pUVar20);
    if (ws->allocStart < pUVar17) {
      ws->allocFailed = '\x01';
      pUVar22 = (U32 *)0x0;
      pUVar17 = pUVar20;
    }
    else {
      ws->tableEnd = pUVar17;
      pUVar22 = pUVar20;
    }
  }
  ms->hashTable3 = pUVar22;
  if (ws->allocFailed != '\0') {
    return 0xffffffffffffffc0;
  }
  if (crp != ZSTDcrp_leaveDirty) {
    pUVar23 = (U32 *)ws->tableValidEnd;
    if (pUVar23 < pUVar17) {
      memset(pUVar23,0,(long)pUVar17 - (long)pUVar23);
      pUVar17 = (U32 *)ws->tableEnd;
      pUVar23 = (U32 *)ws->tableValidEnd;
    }
    if (pUVar23 < pUVar17) {
      ws->tableValidEnd = pUVar17;
    }
  }
  if ((useRowMatchFinder == ZSTD_ps_enable) && (0xfffffffc < cParams->strategy - ZSTD_btlazy2)) {
    uVar8 = __n + 0x3f & 0xffffffffffffffc0;
    ZVar1 = ws->phase;
    if (forWho == ZSTD_resetTarget_CCtx) {
      if ((int)ZVar1 < 1) {
        pvVar9 = ws->objectEnd;
        ws->tableValidEnd = pvVar9;
        ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
        uVar18 = (ulong)(-(int)pvVar9 & 0x3f);
        pUVar17 = (U32 *)((long)pvVar9 + uVar18);
        if (pUVar17 <= ws->workspaceEnd) {
          ws->objectEnd = pUVar17;
          ws->tableEnd = pUVar17;
          if (uVar18 != 0) {
            ws->tableValidEnd = pUVar17;
          }
          ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
          goto LAB_00355455;
        }
LAB_0035546e:
        pUVar23 = (U32 *)0x0;
      }
      else {
LAB_00355455:
        if (uVar8 == 0) goto LAB_0035546e;
        pUVar23 = (U32 *)((long)ws->allocStart - uVar8);
        if (pUVar23 < pUVar17) {
          ws->allocFailed = '\x01';
          goto LAB_0035546e;
        }
        if (pUVar23 < ws->tableValidEnd) {
          ws->tableValidEnd = pUVar23;
        }
        ws->allocStart = pUVar23;
        if (pUVar23 < ws->initOnceStart) {
          uVar18 = (long)ws->initOnceStart - (long)pUVar23;
          if (uVar8 <= uVar18) {
            uVar18 = uVar8;
          }
          memset(pUVar23,0,uVar18);
          ws->initOnceStart = pUVar23;
        }
      }
      ms->tagTable = (BYTE *)pUVar23;
      uVar8 = ms->hashSalt;
      uVar8 = ((uVar8 << 0x28 | uVar8 >> 0x18) ^ (uVar8 << 0xf | uVar8 >> 0x31) ^ uVar8) *
              -0x604de39ae16720db;
      uVar18 = (ulong)ms->hashSaltEntropy;
      uVar18 = ((uVar18 << 0x28 | (ulong)(ms->hashSaltEntropy >> 0x18)) ^ uVar18 << 0xf ^ uVar18) *
               -0x604de39ae16720db;
      uVar8 = ((uVar18 >> 0x23) + 4 ^ uVar18) * -0x604de39ae16720db ^
              ((uVar8 >> 0x23) + 8 ^ uVar8) * -0x604de39ae16720db;
      ms->hashSalt = uVar8 >> 0x1c ^ uVar8;
    }
    else {
      if ((int)ZVar1 < 2) {
        if (ZVar1 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_00355549:
          ws->phase = ZSTD_cwksp_alloc_aligned;
          goto LAB_00355550;
        }
        pvVar9 = ws->objectEnd;
        ws->tableValidEnd = pvVar9;
        ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
        uVar18 = (ulong)(-(int)pvVar9 & 0x3f);
        pUVar17 = (U32 *)((long)pvVar9 + uVar18);
        if (pUVar17 <= ws->workspaceEnd) {
          ws->objectEnd = pUVar17;
          ws->tableEnd = pUVar17;
          if (uVar18 != 0) {
            ws->tableValidEnd = pUVar17;
          }
          goto LAB_00355549;
        }
LAB_00355565:
        pUVar23 = (U32 *)0x0;
      }
      else {
LAB_00355550:
        if (uVar8 == 0) goto LAB_00355565;
        pUVar23 = (U32 *)((long)ws->allocStart - uVar8);
        if (pUVar23 < pUVar17) {
          ws->allocFailed = '\x01';
          goto LAB_00355565;
        }
        if (pUVar23 < ws->tableValidEnd) {
          ws->tableValidEnd = pUVar23;
        }
        ws->allocStart = pUVar23;
      }
      ms->tagTable = (BYTE *)pUVar23;
      memset(pUVar23,0,__n);
      ms->hashSalt = 0;
    }
    uVar7 = 6;
    if (cParams->searchLog < 6) {
      uVar7 = cParams->searchLog;
    }
    uVar16 = 4;
    if (4 < uVar7) {
      uVar16 = uVar7;
    }
    ms->rowHashLog = cParams->hashLog - uVar16;
  }
  if ((forWho != ZSTD_resetTarget_CCtx) || ((int)cParams->strategy < 7)) goto LAB_00355887;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_0035576f:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_00355776;
    }
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      goto LAB_0035576f;
    }
    (ms->opt).litFreq = (uint *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_003557a4;
    }
    (ms->opt).litLengthFreq = (uint *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_003557d2;
    }
    (ms->opt).matchLengthFreq = (uint *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_00355800;
    }
    (ms->opt).offCodeFreq = (uint *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_0035582b;
    }
    (ms->opt).matchTable = (ZSTD_match_t *)0x0;
    pvVar9 = ws->objectEnd;
    ws->tableValidEnd = pvVar9;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar8 = (ulong)(-(int)pvVar9 & 0x3f);
    pvVar9 = (void *)((long)pvVar9 + uVar8);
    if (pvVar9 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar9;
      ws->tableEnd = pvVar9;
      if (uVar8 != 0) {
        ws->tableValidEnd = pvVar9;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_00355859;
    }
LAB_0035586e:
    pZVar12 = (ZSTD_optimal_t *)0x0;
  }
  else {
LAB_00355776:
    puVar10 = (uint *)((long)ws->allocStart - 0x400);
    if (puVar10 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      puVar10 = (uint *)0x0;
    }
    else {
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).litFreq = puVar10;
LAB_003557a4:
    puVar10 = (uint *)((long)ws->allocStart - 0xc0);
    if (puVar10 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      puVar10 = (uint *)0x0;
    }
    else {
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).litLengthFreq = puVar10;
LAB_003557d2:
    puVar10 = (uint *)((long)ws->allocStart - 0x100);
    if (puVar10 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      puVar10 = (uint *)0x0;
    }
    else {
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).matchLengthFreq = puVar10;
LAB_00355800:
    puVar10 = (uint *)((long)ws->allocStart - 0x80);
    if (puVar10 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      puVar10 = (uint *)0x0;
    }
    else {
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).offCodeFreq = puVar10;
LAB_0035582b:
    pZVar11 = (ZSTD_match_t *)((long)ws->allocStart - 0x8040);
    if (pZVar11 < (ZSTD_match_t *)ws->tableEnd) {
      ws->allocFailed = '\x01';
      pZVar11 = (ZSTD_match_t *)0x0;
    }
    else {
      if (pZVar11 < (ZSTD_match_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar11;
      }
      ws->allocStart = pZVar11;
    }
    (ms->opt).matchTable = pZVar11;
LAB_00355859:
    pZVar12 = (ZSTD_optimal_t *)((long)ws->allocStart - 0x1c080);
    if (pZVar12 < (ZSTD_optimal_t *)ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_0035586e;
    }
    if (pZVar12 < (ZSTD_optimal_t *)ws->tableValidEnd) {
      ws->tableValidEnd = pZVar12;
    }
    ws->allocStart = pZVar12;
  }
  (ms->opt).priceTable = pZVar12;
LAB_00355887:
  uVar3 = cParams->windowLog;
  uVar4 = cParams->chainLog;
  uVar5 = cParams->hashLog;
  uVar6 = cParams->searchLog;
  uVar7 = cParams->minMatch;
  uVar16 = cParams->targetLength;
  ZVar2 = cParams->strategy;
  (ms->cParams).searchLog = cParams->searchLog;
  (ms->cParams).minMatch = uVar7;
  (ms->cParams).targetLength = uVar16;
  (ms->cParams).strategy = ZVar2;
  (ms->cParams).windowLog = uVar3;
  (ms->cParams).chainLog = uVar4;
  (ms->cParams).hashLog = uVar5;
  (ms->cParams).searchLog = uVar6;
  return (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}